

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

void * worker_func(void *ctx)

{
  undefined8 *puVar1;
  condvar_handle *condvar;
  bool bVar2;
  worker_priv *priv;
  worker_handle *wh;
  thread_handle *th;
  void *ctx_local;
  
  puVar1 = *(undefined8 **)((long)ctx + 0x10);
  condvar = (condvar_handle *)*puVar1;
  mutex_lock((mutex_handle *)(condvar + 2));
  while (1 < *(uint *)&condvar[7].priv) {
    while( true ) {
      bVar2 = true;
      if (*(int *)&condvar[7].priv != 4) {
        bVar2 = *(int *)&condvar[7].priv == 2;
      }
      if (!bVar2) break;
      if (*(int *)&condvar[7].priv == 2) {
        *(undefined4 *)&condvar[7].priv = 1;
      }
      else {
        *(undefined4 *)&condvar[7].priv = 3;
      }
      mutex_unlock((mutex_handle *)(condvar + 2));
      (*(code *)puVar1[1])(puVar1);
      mutex_lock((mutex_handle *)(condvar + 2));
    }
    if (*(uint *)&condvar[7].priv < 2) break;
    *(undefined4 *)&condvar[7].priv = 5;
    condvar_wake_all(condvar + 1);
    if (*(int *)((long)puVar1 + 0x1c) == 0) {
      condvar_wait(condvar,(mutex_handle *)(condvar + 2));
    }
    else {
      condvar_wait_time(condvar,(mutex_handle *)(condvar + 2),*(uint32_t *)((long)puVar1 + 0x1c));
      if (*(int *)&condvar[7].priv == 5) {
        *(undefined4 *)&condvar[7].priv = 4;
      }
    }
  }
  *(undefined4 *)&condvar[7].priv = 0;
  mutex_unlock((mutex_handle *)(condvar + 2));
  return (void *)0x0;
}

Assistant:

static void *worker_func(void *ctx)
{
	struct thread_handle *th = ctx;
	struct worker_handle *wh = th->func_ctx;
	struct worker_priv *priv = wh->priv;

	mutex_lock(&priv->mutex);

	while (priv->state > WORKER_STOPPING) {
		while (priv->state == WORKER_SIGNALED ||
		       priv->state == WORKER_STOPPING_AFTER_WORK) {
			if (priv->state == WORKER_STOPPING_AFTER_WORK)
				priv->state = WORKER_STOPPING;
			else
				priv->state = WORKER_BUSY;
			mutex_unlock(&priv->mutex);
			wh->func_ptr(wh);
			mutex_lock(&priv->mutex);
		}

		if (priv->state <= WORKER_STOPPING)
			break;

		priv->state = WORKER_IDLE;

		condvar_wake_all(&priv->condvar_idle);

		if (wh->periodic_wake > 0) {
			condvar_wait_time(&priv->condvar, &priv->mutex,
					  wh->periodic_wake);
			if (priv->state == WORKER_IDLE)
				priv->state = WORKER_SIGNALED;
		} else {
			condvar_wait(&priv->condvar, &priv->mutex);
		}
	}

	priv->state = WORKER_STOPPED;

	mutex_unlock(&priv->mutex);

	return NULL;
}